

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void biffwrite(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  ulong uVar2;
  int32_t tmp;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  anon_union_8_4_1dda36f5_for_runsv __ptr;
  ushort *puVar9;
  char typ;
  runsdef val;
  int bin_mode;
  char buf [32];
  uchar local_159;
  runsdef local_158;
  undefined4 local_13c;
  undefined4 local_138;
  
  __stream = (FILE *)bif_get_file(ctx,(int *)0x0,&local_13c);
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  local_158.runstyp = prVar1[-1].runstyp;
  local_158._1_7_ = *(undefined7 *)&prVar1[-1].field_0x1;
  local_158.runsv = *(anon_union_8_4_1dda36f5_for_runsv *)&prVar1[-1].runsv.runsvobj;
  local_159 = local_158.runstyp;
  if (local_13c == 0) {
    if (local_158.runstyp != '\x03') {
LAB_00126b66:
      ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "fwrite";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x3ff);
    }
    puVar9 = (ushort *)(local_158.runsv.runsvnum + 2);
    uVar8 = *(ushort *)local_158.runsv.runsvstr - 2;
    do {
      uVar7 = uVar8;
      if (uVar7 == 0) goto LAB_00126b4b;
      uVar2 = 1;
      uVar8 = uVar7;
      do {
        uVar5 = uVar2;
        cVar6 = (char)*puVar9;
        if ((1 < uVar8) && (cVar6 == '\\')) {
          uVar8 = uVar8 - 1;
          cVar6 = *(char *)((long)puVar9 + 1);
          puVar9 = (ushort *)((long)puVar9 + 1);
          if (cVar6 == 'n') {
            cVar6 = '\n';
          }
          else if (cVar6 == 't') {
            cVar6 = '\t';
          }
        }
        *(char *)((long)&local_13c + uVar5 + 3) = cVar6;
        puVar9 = (ushort *)((long)puVar9 + 1);
        uVar8 = uVar8 - 1;
      } while ((uVar8 != 0) && (uVar2 = uVar5 + 1, uVar5 < 0xff));
      *(undefined1 *)((long)&local_138 + uVar5) = 0;
      iVar3 = fputs((char *)&local_138,__stream);
    } while (iVar3 != -1);
    if (uVar7 == 0) goto LAB_00126b4b;
  }
  else {
    sVar4 = fwrite(&local_159,1,1,__stream);
    if (sVar4 == 1) {
      if (local_159 != '\b') {
        if (local_159 == '\x03') {
          sVar4 = (size_t)*(ushort *)local_158.runsv.runsvstr;
          __ptr = local_158.runsv;
        }
        else {
          if (local_159 != '\x01') goto LAB_00126b66;
          local_138 = local_158.runsv.runsvnum._0_4_;
          sVar4 = 4;
          __ptr.runsvstr = (uchar *)&local_138;
        }
        sVar4 = fwrite(__ptr.runsvstr,sVar4,1,__stream);
        if (sVar4 != 1) goto LAB_00126b18;
      }
LAB_00126b4b:
      runpnil(ctx->bifcxrun);
      return;
    }
  }
LAB_00126b18:
  local_158.runstyp = '\b';
  runpush(ctx->bifcxrun,8,&local_158);
  return;
}

Assistant:

void biffwrite(bifcxdef *ctx, int argc)
{
    osfildef *fp;
    char      typ;
    char      buf[32];
    runsdef   val;
    int       bin_mode;
    
    /* get the file */
    bifcntargs(ctx, 2, argc);
    fp = bif_get_file(ctx, (int *)0, &bin_mode);

    /* get the value to write */
    runpop(ctx->bifcxrun, &val);
    typ = val.runstyp;

    if (bin_mode)
    {
        /* put a byte indicating the type */
        if (osfwb(fp, &typ, 1))
            goto ret_error;
        
        /* see what type of data we want to put */
        switch(typ)
        {
        case DAT_NUMBER:
            oswp4s(buf, val.runsv.runsvnum);
            if (osfwb(fp, buf, 4))
                goto ret_error;
            break;
            
        case DAT_SSTRING:
            /* write the string, including the length prefix */
            if (osfwb(fp, val.runsv.runsvstr, osrp2(val.runsv.runsvstr)))
                goto ret_error;
            break;
            
        case DAT_TRUE:
            /* all we need for this is the type prefix */
            break;
            
        default:
            /* other types are not acceptable */
            runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "fwrite");
        }
    }
    else
    {
        uint rem;
        uchar *p;
        
        switch(typ)
        {
        case DAT_SSTRING:
            /*
             *   Copy and translate the string to our buffer, in pieces if
             *   the size of the string exceeds that of our buffer.  If we
             *   encounter any escape codes, translate them.  
             */
            rem = osrp2(val.runsv.runsvstr) - 2;
            p = val.runsv.runsvstr + 2;
            while (rem > 0)
            {
                uchar *dst;
                uchar buf[256];

                /* fill up the buffer */
                for (dst = buf ;
                     rem != 0 && (size_t)(dst - buf) < sizeof(buf) - 1 ;
                     ++p, --rem)
                {
                    /* if we have an escape character, translate it */
                    if (*p == '\\' && rem > 1)
                    {
                        /* skip the opening slash */
                        ++p;
                        --rem;

                        /* translate it */
                        switch(*p)
                        {
                        case 'n':
                            *dst++ = '\n';
                            break;

                        case 't':
                            *dst++ = '\t';
                            break;

                        default:
                            *dst++ = *p;
                            break;
                        }
                    }
                    else
                    {
                        /* copy this character directly */
                        *dst++ = *p;
                    }
                }

                /* null-terminate the buffer */
                *dst = '\0';

                /* write it out */
                if (osfputs((char *)buf, fp) == EOF)
                    goto ret_error;
            }

            /* done */
            break;

        default:
            /* other types are not allowed */
            runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "fwrite");
        }
    }

    /* success */
    runpnil(ctx->bifcxrun);
    return;

ret_error:
    val.runstyp = DAT_TRUE;
    runpush(ctx->bifcxrun, DAT_TRUE, &val);
}